

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::decompressDXT3(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint32 *puVar9;
  int iVar10;
  uint32 *puVar11;
  uint32 k_2;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint local_98 [4];
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint32 c [4] [4];
  uint8 a [16];
  uint8 idx [16];
  
  iVar13 = 0;
  iVar10 = 0;
  for (lVar15 = 0; lVar15 < h * w; lVar15 = lVar15 + 0x10) {
    uVar1 = *(ushort *)(src + lVar15 + 8);
    uVar2 = *(ushort *)(src + lVar15 + 10);
    local_98[0] = ((uint)(uVar1 >> 0xb) * 0xff) / 0x1f;
    sVar3 = (short)local_98[0];
    local_98[1] = ((uVar1 >> 5 & 0x3f) * 0xff) / 0x3f;
    local_98[2] = ((uVar1 & 0x1f) * 0xff) / 0x1f;
    local_88 = ((uint)(uVar2 >> 0xb) * 0xff) / 0x1f;
    sVar4 = (short)local_88;
    local_84 = ((uVar2 >> 5 & 0x3f) * 0xff) / 0x3f;
    local_80 = ((uVar2 & 0x1f) * 0xff) / 0x1f;
    local_78 = (ushort)(sVar4 + sVar3 * 2) / 3;
    local_74 = (local_84 + local_98[1] * 2) / 3;
    local_70 = (local_80 + local_98[2] * 2) / 3;
    c[0][0] = (ushort)(sVar3 + sVar4 * 2) / 3;
    c[0][1] = (local_98[1] + local_84 * 2) / 3;
    c[0][2] = (local_98[2] + local_80 * 2) / 3;
    uVar5 = *(uint *)(src + lVar15 + 0xc);
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      *(byte *)((long)c[2] + lVar8) = (byte)uVar5 & 3;
      uVar5 = uVar5 >> 2;
    }
    uVar7 = *(ulong *)(src + lVar15);
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      *(byte *)((long)c[1] + lVar8) = ((byte)uVar7 & 0xf) * '\x11';
      uVar7 = uVar7 >> 4;
    }
    iVar6 = w * iVar13 + iVar10;
    puVar9 = c[1];
    puVar11 = c[2];
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
        uVar7 = (ulong)*(byte *)((long)puVar11 + lVar12);
        uVar14 = (ulong)(uint)(iVar6 + (int)lVar12);
        adst[uVar14 * 4] = (uint8)local_98[uVar7 * 4];
        adst[uVar14 * 4 + 1] = (uint8)local_98[uVar7 * 4 + 1];
        adst[uVar14 * 4 + 2] = (uint8)local_98[uVar7 * 4 + 2];
        adst[uVar14 * 4 + 3] = *(uint8 *)((long)puVar9 + lVar12);
      }
      puVar11 = puVar11 + 1;
      puVar9 = puVar9 + 1;
      iVar6 = iVar6 + w;
    }
    iVar10 = iVar10 + 4;
    if (w <= iVar10) {
      iVar10 = 0;
      iVar13 = iVar13 + 4;
    }
  }
  return;
}

Assistant:

void
decompressDXT3(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint8 idx[16];
	uint8 a[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h; j += 16){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+8]);
		uint32 col1 = *((uint16*)&src[j+10]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;

		c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
		c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
		c[2][2] = (2*c[0][2] + 1*c[1][2])/3;

		c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
		c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
		c[3][2] = (1*c[0][2] + 2*c[1][2])/3;

		/* make index list */
		uint32 indices = *((uint32*)&src[j+12]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}
		uint64 alphas = *((uint64*)&src[j+0]);
		for(int32 k = 0; k < 16; k++){
			a[k] = (alphas & 0xF)*17;
			alphas >>= 4;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = a[l*4+k];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}